

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O2

void TIFFReadDirEntryCheckedFloat(TIFF *tif,TIFFDirEntry *direntry,float *value)

{
  *value = (float)(direntry->tdir_offset).toff_long;
  if ((tif->tif_flags & 0x80) == 0) {
    return;
  }
  TIFFSwabLong((uint32_t *)value);
  return;
}

Assistant:

static void TIFFReadDirEntryCheckedFloat(TIFF *tif, TIFFDirEntry *direntry,
                                         float *value)
{
    union
    {
        float f;
        uint32_t i;
    } float_union;
    assert(sizeof(float) == 4);
    assert(sizeof(uint32_t) == 4);
    assert(sizeof(float_union) == 4);
    float_union.i = *(uint32_t *)(&direntry->tdir_offset);
    *value = float_union.f;
    if (tif->tif_flags & TIFF_SWAB)
        TIFFSwabLong((uint32_t *)value);
}